

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# port_connector_change_entry.c
# Opt level: O0

apx_portInstance_t *
apx_portConnectorChangeEntry_get(apx_portConnectorChangeEntry_t *self,int32_t index)

{
  apx_portInstance_t *local_20;
  apx_portInstance_t *retval;
  int32_t index_local;
  apx_portConnectorChangeEntry_t *self_local;
  
  local_20 = (apx_portInstance_t *)0x0;
  if (((self != (apx_portConnectorChangeEntry_t *)0x0) && (self->count != 0)) && (-1 < index)) {
    if ((self->count == 1) || (self->count == -1)) {
      if (index == 0) {
        local_20 = (self->data).port_instance;
      }
    }
    else if (((self->count < 0) && (SBORROW4(index,-self->count) != index + self->count < 0)) ||
            ((0 < self->count && (index < self->count)))) {
      local_20 = (apx_portInstance_t *)adt_ary_value((self->data).array,index);
    }
  }
  return local_20;
}

Assistant:

apx_portInstance_t *apx_portConnectorChangeEntry_get(apx_portConnectorChangeEntry_t *self, int32_t index)
{
   apx_portInstance_t *retval = (apx_portInstance_t*) 0;
   if ( (self != 0) && (self->count != 0) && (index >= 0) )
   {
      if ( (self->count == 1) || (self->count == -1) )
      {
         if (index == 0)
         {
            retval = self->data.port_instance;
         }
      }
      else
      {
         if ( ( (self->count < 0) && (index < -self->count) ) || ( (self->count > 0) && (index < self->count) ) )
         {
            retval = (apx_portInstance_t*) adt_ary_value(self->data.array, index);
         }
      }
   }
   return retval;
}